

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

void Curl_pgrsStartNow(Curl_easy *data)

{
  undefined8 uVar1;
  undefined4 uVar2;
  curltime cVar3;
  undefined4 uStack_14;
  Curl_easy *data_local;
  
  (data->progress).speeder_c = 0;
  cVar3 = Curl_now();
  (data->progress).start.tv_sec = cVar3.tv_sec;
  *(ulong *)&(data->progress).start.tv_usec = CONCAT44(uStack_14,cVar3.tv_usec);
  (data->progress).field_0x184 = (data->progress).field_0x184 & 0xfd;
  (data->progress).ul_limit_start.tv_sec = 0;
  (data->progress).ul_limit_start.tv_usec = 0;
  (data->progress).dl_limit_start.tv_sec = 0;
  (data->progress).dl_limit_start.tv_usec = 0;
  (data->progress).flags = (data->progress).flags & 0x90;
  uVar1 = (data->progress).start.tv_sec;
  uVar2 = (data->progress).start.tv_usec;
  cVar3.tv_usec = uVar2;
  cVar3.tv_sec = uVar1;
  cVar3._12_4_ = 0;
  Curl_ratelimit(data,cVar3);
  return;
}

Assistant:

void Curl_pgrsStartNow(struct Curl_easy *data)
{
  data->progress.speeder_c = 0; /* reset the progress meter display */
  data->progress.start = Curl_now();
  data->progress.is_t_startransfer_set = false;
  data->progress.ul_limit_start.tv_sec = 0;
  data->progress.ul_limit_start.tv_usec = 0;
  data->progress.dl_limit_start.tv_sec = 0;
  data->progress.dl_limit_start.tv_usec = 0;
  /* clear all bits except HIDE and HEADERS_OUT */
  data->progress.flags &= PGRS_HIDE|PGRS_HEADERS_OUT;
  Curl_ratelimit(data, data->progress.start);
}